

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::getSuggestedCutoffRadius(EAM *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  AtomType *in_RDX;
  AtomType *in_RSI;
  EAMAtomData *in_RDI;
  EAMAtomData data2;
  EAMAtomData data1;
  int eamtid2;
  int eamtid1;
  int atid2;
  int atid1;
  RealType cut;
  EAM *in_stack_00000240;
  EAMAtomData *in_stack_fffffffffffffef0;
  double local_c0;
  double local_50;
  double local_20;
  
  if (((ulong)(in_RDI->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    initialize(in_stack_00000240);
  }
  local_20 = 0.0;
  iVar1 = AtomType::getIdent(in_RSI);
  iVar2 = AtomType::getIdent(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&in_RDI->phiCV,(long)iVar1);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&in_RDI->phiCV,(long)iVar2);
  iVar2 = *pvVar3;
  if (iVar1 != -1) {
    std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
              ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)
               &in_RDI->nValence,(long)iVar1);
    EAMAtomData::EAMAtomData(in_stack_fffffffffffffef0,in_RDI);
    local_20 = local_50;
    EAMAtomData::~EAMAtomData(in_stack_fffffffffffffef0);
  }
  if (iVar2 != -1) {
    std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
              ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)
               &in_RDI->nValence,(long)iVar2);
    EAMAtomData::EAMAtomData(in_stack_fffffffffffffef0,in_RDI);
    if (local_20 < local_c0) {
      local_20 = local_c0;
    }
    EAMAtomData::~EAMAtomData(in_stack_fffffffffffffef0);
  }
  return local_20;
}

Assistant:

RealType EAM::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    RealType cut = 0.0;

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int eamtid1 = EAMtids[atid1];
    int eamtid2 = EAMtids[atid2];

    if (eamtid1 != -1) {
      EAMAtomData data1 = EAMdata[eamtid1];
      cut               = data1.rcut;
    }

    if (eamtid2 != -1) {
      EAMAtomData data2 = EAMdata[eamtid2];
      if (data2.rcut > cut) cut = data2.rcut;
    }

    return cut;
  }